

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
ZXing::Pdf417::ReadCodeWords<ZXing::PointT<double>>
          (BitMatrixCursor<ZXing::PointT<double>_> topCur,SymbolInfo info)

{
  bool bVar1;
  CodeWord CVar2;
  long lVar3;
  long lVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  undefined4 uVar10;
  undefined1 auVar9 [16];
  undefined4 uVar11;
  BitMatrix *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  double in_stack_00000020;
  double in_stack_00000028;
  int in_stack_00000034;
  int in_stack_00000038;
  int in_stack_0000003c;
  int in_stack_00000040;
  int in_stack_00000044;
  int in_stack_0000004c;
  float in_stack_00000050;
  allocator_type local_cd;
  int local_cc;
  ulong local_c8;
  vector<int,_std::allocator<int>_> *local_c0;
  float local_b4;
  int local_b0;
  int local_ac;
  undefined1 local_a8 [24];
  ulong local_90;
  BitMatrix *local_88;
  BitMatrixCursor<ZXing::PointT<double>_> local_80;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  local_a8._8_8_ = in_stack_00000028;
  local_a8._0_8_ = in_stack_00000020;
  if (in_stack_00000044 < in_stack_00000040) {
    dVar8 = in_stack_00000020 * (double)(in_stack_00000034 + -1) + (double)in_stack_00000010._8_8_;
    in_stack_00000010._8_4_ = SUB84(dVar8,0);
    in_stack_00000010._0_8_ =
         (double)in_stack_00000010._0_8_ - in_stack_00000028 * (double)(in_stack_00000034 + -1);
    in_stack_00000010._12_4_ = (int)((ulong)dVar8 >> 0x20);
    dStack_50 = -in_stack_00000020;
    local_58 = in_stack_00000028;
    iVar5 = in_stack_00000044;
  }
  else {
    local_58 = -in_stack_00000028;
    dStack_50 = in_stack_00000020;
    iVar5 = in_stack_00000040;
    in_stack_00000040 = in_stack_00000044;
  }
  local_c8 = (ulong)in_stack_0000003c;
  local_80.img = (BitMatrix *)CONCAT44(local_80.img._4_4_,0xffffffff);
  local_c0 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            (in_RDI,(long)(in_stack_0000003c * in_stack_00000038),(value_type_conflict3 *)&local_80,
             &local_cd);
  local_ac = in_stack_00000040 + 1;
  if (in_stack_00000038 <= in_stack_00000040 + 1) {
    local_ac = in_stack_00000038;
  }
  if (iVar5 < local_ac) {
    local_b0 = (in_stack_0000004c * 3) / 2;
    local_90 = local_c8 & 0xffffffff;
    local_b4 = in_stack_00000050;
    local_88 = in_stack_00000008;
    local_48 = (double)in_stack_00000010._0_8_;
    dStack_40 = (double)in_stack_00000010._8_8_;
    auVar9 = _DAT_001922a0 & local_a8._0_16_;
    uVar10 = auVar9._8_4_;
    uVar11 = auVar9._12_4_;
    if (auVar9._8_8_ <= auVar9._0_8_) {
      uVar10 = auVar9._0_4_;
      uVar11 = auVar9._4_4_;
    }
    auVar9._4_4_ = uVar11;
    auVar9._0_4_ = uVar10;
    auVar9._8_4_ = uVar10;
    auVar9._12_4_ = uVar11;
    local_a8._0_16_ = divpd(local_a8._0_16_,auVar9);
    lVar7 = (long)iVar5;
    lVar3 = lVar7 * local_c8;
    local_cc = iVar5;
    do {
      dVar8 = (double)(int)(((float)((int)lVar7 - local_cc) + 0.5) * local_b4);
      local_80.img = local_88;
      local_80.p.x = dVar8 * local_58 + local_48;
      local_80.p.y = dVar8 * dStack_50 + dStack_40;
      local_80.d.x = (double)local_a8._0_8_;
      local_80.d.y = (double)local_a8._8_8_;
      bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::isWhite(&local_80);
      BitMatrixCursor<ZXing::PointT<double>_>::stepToEdge(&local_80,bVar1 | 8,local_b0,false);
      iVar5 = ((int)lVar7 % 3) * 3;
      ReadCodeWord<ZXing::PointT<double>>(&local_80,iVar5);
      lVar4 = lVar3;
      uVar6 = local_90;
      if (0 < (int)local_c8) {
        do {
          if ((((local_80.p.x < 0.0) || ((double)(local_80.img)->_width <= local_80.p.x)) ||
              (local_80.p.y < 0.0)) || ((double)(local_80.img)->_height <= local_80.p.y)) break;
          CVar2 = ReadCodeWord<ZXing::PointT<double>>(&local_80,iVar5);
          (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[lVar4] = CVar2.code;
          uVar6 = uVar6 - 1;
          lVar4 = lVar4 + 1;
        } while (uVar6 != 0);
      }
      lVar7 = lVar7 + 1;
      lVar3 = lVar3 + local_c8;
    } while (local_ac != (int)lVar7);
  }
  return local_c0;
}

Assistant:

std::vector<int> ReadCodeWords(BitMatrixCursor<POINT> topCur, SymbolInfo info)
{
	printf("rows: %d, cols: %d, rowHeight: %.1f, colWidth: %d, firstRow: %d, lastRow: %d, ecLevel: %d\n", info.nRows,
		   info.nCols, info.rowHeight, info.colWidth, info.firstRow, info.lastRow, info.ecLevel);
	auto print = [](CodeWord c [[maybe_unused]]) { printf("%4d.%d ", c.code, c.cluster); };

	auto rowSkip = topCur.right();
	if (info.firstRow > info.lastRow) {
		topCur.p += (info.height - 1) * rowSkip;
		rowSkip = -rowSkip;
		std::swap(info.firstRow, info.lastRow);
	}

	int maxColWidth = info.colWidth * 3 / 2;
	std::vector<int> codeWords(info.nRows * info.nCols, -1);
	for (int row = info.firstRow; row < std::min(info.nRows, info.lastRow + 1); ++row) {
		int cluster = (row % 3) * 3;
		auto cur = topCur.movedBy(int((row - info.firstRow + 0.5f) * info.rowHeight) * rowSkip);
		// skip start pattern
		cur.stepToEdge(8 + cur.isWhite(), maxColWidth);
		// read off left row indicator column
		auto cw [[maybe_unused]] = ReadCodeWord(cur, cluster);
		printf("%3dx%3d:%2d: ", int(cur.p.x), int(cur.p.y), Row(cw));
		print(cw);

		for (int col = 0; col < info.nCols && cur.isIn(); ++col) {
			auto cw = ReadCodeWord(cur, cluster);
			codeWords[row * info.nCols + col] = cw.code;
			print(cw);
		}

#ifdef PRINT_DEBUG
		print(ReadCodeWord(cur));
		printf("\n");
		fflush(stdout);
#endif
	}

	return codeWords;
}